

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getStateDir.cpp
# Opt level: O2

int main(void)

{
  string sStack_28;
  
  sago::getStateDir_abi_cxx11_();
  run_test(&sStack_28);
  std::__cxx11::string::~string((string *)&sStack_28);
  return 0;
}

Assistant:

int main() {
	run_test(sago::getStateDir());
	return 0;
}